

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddTable.c
# Opt level: O3

int cuddInsertSubtables(DdManager *unique,int n,int level)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  DdSubtable *pDVar3;
  int *piVar4;
  int *piVar5;
  DdNode *T;
  MtrNode *treenode;
  void *__ptr;
  undefined8 uVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  DdSubtable *pDVar12;
  DdSubtable *pDVar13;
  DdSubtable *__ptr_00;
  DdSubtable *pDVar14;
  unsigned_long uVar15;
  DdNode **ppDVar16;
  ulong uVar17;
  DdNode *pDVar18;
  ulong uVar19;
  ulong uVar20;
  ulong uVar21;
  long lVar22;
  uint uVar23;
  uint uVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  size_t __size;
  ulong uVar29;
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  int iVar39;
  int *local_60;
  int local_58;
  int iStack_54;
  int iStack_50;
  int iStack_4c;
  int local_48;
  int iStack_44;
  int iStack_40;
  int iStack_3c;
  
  uVar29 = (ulong)(uint)n;
  uVar24 = unique->initSlots;
  uVar17 = (ulong)uVar24;
  uVar11 = unique->size;
  uVar21 = (ulong)uVar11;
  iVar9 = unique->maxSize;
  lVar22 = (long)(int)uVar11;
  iVar7 = uVar11 + n;
  if (iVar9 < iVar7) {
    iVar8 = iVar7 + 10;
    lVar28 = (long)iVar8;
    pDVar12 = (DdSubtable *)malloc(lVar28 * 0x38);
    if (pDVar12 == (DdSubtable *)0x0) {
LAB_007a04b2:
      unique->errorCode = CUDD_MEMORY_OUT;
    }
    else {
      pDVar13 = (DdSubtable *)malloc(lVar28 * 8);
      if (pDVar13 == (DdSubtable *)0x0) {
        unique->errorCode = CUDD_MEMORY_OUT;
      }
      else {
        __size = lVar28 << 2;
        __ptr_00 = (DdSubtable *)malloc(__size);
        if (__ptr_00 == (DdSubtable *)0x0) {
          unique->errorCode = CUDD_MEMORY_OUT;
          free(pDVar12);
          pDVar12 = pDVar13;
        }
        else {
          pDVar14 = (DdSubtable *)malloc(__size);
          if (pDVar14 != (DdSubtable *)0x0) {
            if (unique->map == (int *)0x0) {
              uVar15 = unique->memused;
              lVar28 = (long)(iVar8 - iVar9);
              local_60 = (int *)0x0;
            }
            else {
              local_60 = (int *)malloc(__size);
              if (local_60 == (int *)0x0) {
                unique->errorCode = CUDD_MEMORY_OUT;
                free(pDVar12);
                free(pDVar13);
                free(__ptr_00);
                pDVar12 = pDVar14;
                goto LAB_007a0695;
              }
              lVar28 = (long)(iVar8 - iVar9);
              uVar15 = lVar28 * 4 + unique->memused;
            }
            unique->memused = ((ulong)(uVar24 + 1) * 8 + 0x40) * lVar28 + uVar15;
            if (0 < level) {
              pDVar3 = unique->subtables;
              piVar4 = unique->perm;
              ppDVar16 = unique->vars;
              piVar5 = unique->invperm;
              lVar28 = 0;
              lVar25 = 0;
              do {
                puVar1 = (undefined8 *)((long)&pDVar3->shift + lVar28);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pDVar12->shift + lVar28);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                *(undefined4 *)((long)&pDVar12->dead + lVar28) =
                     *(undefined4 *)((long)&pDVar3->dead + lVar28);
                *(undefined8 *)((long)&pDVar12->nodelist + lVar28) =
                     *(undefined8 *)((long)&pDVar3->nodelist + lVar28);
                puVar1 = (undefined8 *)((long)&pDVar3->bindVar + lVar28);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pDVar12->bindVar + lVar28);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                *(undefined4 *)((long)&pDVar12->varToBeGrouped + lVar28) =
                     *(undefined4 *)((long)&pDVar3->varToBeGrouped + lVar28);
                *(undefined8 *)((long)&pDVar13->nodelist + lVar25 * 2) =
                     *(undefined8 *)((long)ppDVar16 + lVar25 * 2);
                *(undefined4 *)((long)&__ptr_00->nodelist + lVar25) =
                     *(undefined4 *)((long)piVar4 + lVar25);
                *(undefined4 *)((long)&pDVar14->nodelist + lVar25) =
                     *(undefined4 *)((long)piVar5 + lVar25);
                lVar25 = lVar25 + 4;
                lVar28 = lVar28 + 0x38;
              } while ((ulong)(uint)level << 2 != lVar25);
            }
            if (uVar11 - level != 0 && level <= (int)uVar11) {
              piVar4 = unique->perm;
              lVar28 = (long)level;
              do {
                *(int *)((long)&__ptr_00->nodelist + lVar28 * 4) = piVar4[lVar28];
                lVar28 = lVar28 + 1;
              } while (lVar22 != lVar28);
            }
            if (0 < n) {
              lVar25 = (long)level;
              lVar28 = uVar17 - 1;
              auVar37._8_4_ = (int)lVar28;
              auVar37._0_8_ = lVar28;
              auVar37._12_4_ = (int)((ulong)lVar28 >> 0x20);
              auVar37 = auVar37 ^ _DAT_007ee2e0;
              do {
                pDVar12[lVar25].slots = uVar24;
                iVar9 = cuddComputeFloorLog2(uVar24);
                pDVar12[lVar25].shift = 0x20 - iVar9;
                pDVar12[lVar25].keys = 0;
                pDVar12[lVar25].maxKeys = uVar24 * 4;
                pDVar12[lVar25].dead = 0;
                iVar9 = (uVar11 - level) + (int)lVar25;
                pDVar3 = pDVar12 + lVar25;
                pDVar3->bindVar = 0;
                pDVar3->varType = CUDD_VAR_PRIMARY_INPUT;
                pDVar3->pairIndex = 0;
                pDVar3->varHandled = 0;
                pDVar12[lVar25].varToBeGrouped = CUDD_LAZY_NONE;
                *(int *)((long)&__ptr_00->nodelist + (long)iVar9 * 4) = (int)lVar25;
                *(int *)((long)&pDVar14->nodelist + lVar25 * 4) = iVar9;
                ppDVar16 = (DdNode **)malloc(uVar17 * 8);
                pDVar12[lVar25].nodelist = ppDVar16;
                auVar36 = _DAT_007ee2e0;
                if (ppDVar16 == (DdNode **)0x0) goto LAB_007a04b2;
                local_48 = auVar37._0_4_;
                iStack_44 = auVar37._4_4_;
                iStack_40 = auVar37._8_4_;
                iStack_3c = auVar37._12_4_;
                if (uVar24 != 0) {
                  uVar20 = 0;
                  auVar31 = _DAT_007ee2d0;
                  do {
                    auVar34 = auVar31 ^ auVar36;
                    if ((bool)(~(iStack_44 < auVar34._4_4_ ||
                                local_48 < auVar34._0_4_ && auVar34._4_4_ == iStack_44) & 1)) {
                      *(DdManager **)((long)ppDVar16 + uVar20) = unique;
                    }
                    if (auVar34._12_4_ <= iStack_3c &&
                        (auVar34._8_4_ <= iStack_40 || auVar34._12_4_ != iStack_3c)) {
                      *(DdManager **)((long)ppDVar16 + uVar20 + 8) = unique;
                    }
                    lVar28 = auVar31._8_8_;
                    auVar31._0_8_ = auVar31._0_8_ + 2;
                    auVar31._8_8_ = lVar28 + 2;
                    uVar20 = uVar20 + 0x10;
                  } while ((uVar17 * 8 + 8 & 0xfffffffffffffff0) != uVar20);
                }
                lVar25 = lVar25 + 1;
              } while (lVar25 < n + level);
            }
            if (level < (int)uVar11) {
              pDVar3 = unique->subtables;
              lVar26 = (long)level;
              lVar25 = (long)n;
              lVar28 = lVar26 * 0x38;
              ppDVar16 = unique->vars;
              piVar4 = unique->invperm;
              lVar27 = 0;
              do {
                puVar1 = (undefined8 *)((long)&pDVar3->shift + lVar28);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pDVar12[lVar25].shift + lVar28);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                *(undefined4 *)((long)&pDVar12[lVar25].dead + lVar28) =
                     *(undefined4 *)((long)&pDVar3->dead + lVar28);
                *(undefined8 *)((long)&pDVar12[lVar25].nodelist + lVar28) =
                     *(undefined8 *)((long)&pDVar3->nodelist + lVar28);
                puVar1 = (undefined8 *)((long)&pDVar3->bindVar + lVar28);
                uVar6 = puVar1[1];
                puVar2 = (undefined8 *)((long)&pDVar12[lVar25].bindVar + lVar28);
                *puVar2 = *puVar1;
                puVar2[1] = uVar6;
                *(undefined4 *)((long)&pDVar12[lVar25].varToBeGrouped + lVar28) =
                     *(undefined4 *)((long)&pDVar3->varToBeGrouped + lVar28);
                (&pDVar13->nodelist)[lVar26 + lVar27] = (DdNode **)ppDVar16[lVar26 + lVar27];
                iVar9 = piVar4[lVar26 + lVar27];
                piVar5 = (int *)((long)&__ptr_00->nodelist + (long)iVar9 * 4);
                *piVar5 = *piVar5 + n;
                *(int *)((long)&pDVar14->nodelist + lVar27 * 4 + (lVar25 + lVar26) * 4) = iVar9;
                lVar28 = lVar28 + 0x38;
                lVar27 = lVar27 + 1;
              } while (lVar22 - lVar26 != lVar27);
            }
            piVar4 = unique->map;
            if (piVar4 != (int *)0x0) {
              if (0 < (int)uVar11) {
                uVar17 = 0;
                do {
                  local_60[uVar17] = piVar4[uVar17];
                  uVar17 = uVar17 + 1;
                } while (uVar21 != uVar17);
              }
              auVar37 = _DAT_007ee2e0;
              auVar36 = _DAT_007ee2d0;
              if (0 < n) {
                lVar28 = lVar22 + 1;
                if (lVar22 + 1 < (long)iVar7) {
                  lVar28 = (long)iVar7;
                }
                lVar25 = (lVar28 - lVar22) + -1;
                auVar32._8_4_ = (int)lVar25;
                auVar32._0_8_ = lVar25;
                auVar32._12_4_ = (int)((ulong)lVar25 >> 0x20);
                uVar17 = 0;
                auVar32 = auVar32 ^ _DAT_007ee2e0;
                do {
                  auVar38._8_4_ = (int)uVar17;
                  auVar38._0_8_ = uVar17;
                  auVar38._12_4_ = (int)(uVar17 >> 0x20);
                  auVar34 = (auVar38 | auVar36) ^ auVar37;
                  iVar9 = (int)uVar21;
                  if ((bool)(~(auVar34._4_4_ == auVar32._4_4_ && auVar32._0_4_ < auVar34._0_4_ ||
                              auVar32._4_4_ < auVar34._4_4_) & 1)) {
                    local_60[lVar22 + uVar17] = iVar9;
                  }
                  if ((auVar34._12_4_ != auVar32._12_4_ || auVar34._8_4_ <= auVar32._8_4_) &&
                      auVar34._12_4_ <= auVar32._12_4_) {
                    local_60[lVar22 + uVar17 + 1] = iVar9 + 1;
                  }
                  uVar17 = uVar17 + 2;
                  uVar21 = (ulong)(iVar9 + 2);
                } while (((lVar28 - lVar22) + 1U & 0xfffffffffffffffe) != uVar17);
              }
              free(piVar4);
              unique->map = local_60;
            }
            if (unique->subtables != (DdSubtable *)0x0) {
              free(unique->subtables);
            }
            unique->subtables = pDVar12;
            unique->maxSize = iVar8;
            if (unique->vars != (DdNode **)0x0) {
              free(unique->vars);
            }
            unique->vars = (DdNode **)pDVar13;
            if (unique->perm != (int *)0x0) {
              free(unique->perm);
            }
            unique->perm = (int *)__ptr_00;
            if (unique->invperm != (int *)0x0) {
              free(unique->invperm);
            }
            unique->invperm = (int *)pDVar14;
            if (unique->maxSizeZ < iVar8) {
              if (unique->stack != (DdNode **)0x0) {
                free(unique->stack);
              }
              ppDVar16 = (DdNode **)malloc((long)iVar7 * 8 + 0x58);
              unique->stack = ppDVar16;
              if (ppDVar16 == (DdNode **)0x0) {
                unique->errorCode = CUDD_MEMORY_OUT;
                goto LAB_007a069a;
              }
              *ppDVar16 = (DdNode *)0x0;
              iVar9 = unique->maxSize;
              if (unique->maxSize < unique->maxSizeZ) {
                iVar9 = unique->maxSizeZ;
              }
              unique->memused = unique->memused + (long)(iVar8 - iVar9) * 8;
            }
            goto LAB_007a037d;
          }
          unique->errorCode = CUDD_MEMORY_OUT;
          free(pDVar12);
          free(pDVar13);
          pDVar12 = __ptr_00;
        }
      }
LAB_007a0695:
      free(pDVar12);
    }
LAB_007a069a:
    iVar9 = 0;
  }
  else {
    if (level < (int)uVar11) {
      pDVar12 = unique->subtables;
      piVar4 = unique->perm;
      piVar5 = unique->invperm;
      lVar28 = lVar22;
      lVar25 = lVar22 * 0xe;
      do {
        uVar6 = *(undefined8 *)(&pDVar12[-1].shift + lVar25 + 2);
        *(undefined8 *)(&pDVar12[(long)n + -1].shift + lVar25) =
             *(undefined8 *)(&pDVar12[-1].shift + lVar25);
        *(undefined8 *)(&pDVar12[(long)n + -1].shift + lVar25 + 2) = uVar6;
        (&pDVar12[(long)n + -1].dead)[lVar25] = (&pDVar12[-1].dead)[lVar25];
        *(undefined8 *)((long)&pDVar12[(long)n + -1].nodelist + lVar25 * 4) =
             *(undefined8 *)((long)&pDVar12[-1].nodelist + lVar25 * 4);
        uVar6 = *(undefined8 *)(&pDVar12[-1].bindVar + lVar25 + 2);
        *(undefined8 *)(&pDVar12[(long)n + -1].bindVar + lVar25) =
             *(undefined8 *)(&pDVar12[-1].bindVar + lVar25);
        *(undefined8 *)(&pDVar12[(long)n + -1].bindVar + lVar25 + 2) = uVar6;
        (&pDVar12[(long)n + -1].varToBeGrouped)[lVar25] = (&pDVar12[-1].varToBeGrouped)[lVar25];
        iVar9 = piVar5[lVar28 + -1];
        piVar5[(long)n + lVar28 + -1] = iVar9;
        piVar4[iVar9] = piVar4[iVar9] + n;
        lVar28 = lVar28 + -1;
        lVar25 = lVar25 + -0xe;
      } while (level < lVar28);
    }
    if (0 < n) {
      pDVar12 = unique->subtables;
      lVar28 = uVar17 - 1;
      auVar36._8_4_ = (int)lVar28;
      auVar36._0_8_ = lVar28;
      auVar36._12_4_ = (int)((ulong)lVar28 >> 0x20);
      auVar36 = auVar36 ^ _DAT_007ee2e0;
      uVar20 = 0;
      do {
        lVar28 = uVar20 + (long)level;
        pDVar12[lVar28].slots = uVar24;
        iVar9 = cuddComputeFloorLog2(uVar24);
        pDVar12 = unique->subtables;
        pDVar12[lVar28].shift = 0x20 - iVar9;
        pDVar12[lVar28].keys = 0;
        pDVar12[lVar28].maxKeys = uVar24 * 4;
        pDVar12[lVar28].dead = 0;
        pDVar12[lVar28].varToBeGrouped = CUDD_LAZY_NONE;
        pDVar13 = pDVar12 + lVar28;
        pDVar13->bindVar = 0;
        pDVar13->varType = CUDD_VAR_PRIMARY_INPUT;
        pDVar13->pairIndex = 0;
        pDVar13->varHandled = 0;
        unique->perm[lVar22 + uVar20] = (int)lVar28;
        unique->invperm[lVar28] = (int)(lVar22 + uVar20);
        ppDVar16 = (DdNode **)malloc(uVar17 * 8);
        pDVar12[lVar28].nodelist = ppDVar16;
        auVar37 = _DAT_007ee2e0;
        if (ppDVar16 == (DdNode **)0x0) goto LAB_007a04b2;
        local_58 = auVar36._0_4_;
        iStack_54 = auVar36._4_4_;
        iStack_50 = auVar36._8_4_;
        iStack_4c = auVar36._12_4_;
        if (uVar24 != 0) {
          uVar19 = 0;
          auVar34 = _DAT_007ee2d0;
          do {
            auVar33 = auVar34 ^ auVar37;
            if ((bool)(~(iStack_54 < auVar33._4_4_ ||
                        local_58 < auVar33._0_4_ && auVar33._4_4_ == iStack_54) & 1)) {
              *(DdManager **)((long)ppDVar16 + uVar19) = unique;
            }
            if (auVar33._12_4_ <= iStack_4c &&
                (auVar33._8_4_ <= iStack_50 || auVar33._12_4_ != iStack_4c)) {
              *(DdManager **)((long)ppDVar16 + uVar19 + 8) = unique;
            }
            lVar28 = auVar34._8_8_;
            auVar34._0_8_ = auVar34._0_8_ + 2;
            auVar34._8_8_ = lVar28 + 2;
            uVar19 = uVar19 + 0x10;
          } while ((uVar17 * 8 + 8 & 0xfffffffffffffff0) != uVar19);
        }
        uVar20 = uVar20 + 1;
      } while (uVar20 != uVar29);
      piVar4 = unique->map;
      if (piVar4 != (int *)0x0 && 0 < n) {
        lVar28 = uVar29 - 1;
        auVar30._8_4_ = (int)lVar28;
        auVar30._0_8_ = lVar28;
        auVar30._12_4_ = (int)((ulong)lVar28 >> 0x20);
        lVar28 = 0;
        auVar30 = auVar30 ^ auVar37;
        auVar33 = _DAT_007ee2c0;
        auVar35 = _DAT_007ee2d0;
        do {
          auVar36 = auVar35 ^ auVar37;
          iVar8 = auVar30._4_4_;
          iVar9 = (int)uVar21;
          if ((bool)(~(auVar36._4_4_ == iVar8 && auVar30._0_4_ < auVar36._0_4_ ||
                      iVar8 < auVar36._4_4_) & 1)) {
            *(int *)((long)piVar4 + lVar28 + lVar22 * 4) = iVar9;
          }
          if ((auVar36._12_4_ != auVar30._12_4_ || auVar36._8_4_ <= auVar30._8_4_) &&
              auVar36._12_4_ <= auVar30._12_4_) {
            *(int *)((long)piVar4 + lVar28 + lVar22 * 4 + 4) = iVar9 + 1;
          }
          iVar39 = SUB164(auVar33 ^ auVar37,4);
          if (iVar39 <= iVar8 && (iVar39 != iVar8 || SUB164(auVar33 ^ auVar37,0) <= auVar30._0_4_))
          {
            *(int *)((long)piVar4 + lVar28 + lVar22 * 4 + 8) = iVar9 + 2;
            *(int *)((long)piVar4 + lVar28 + lVar22 * 4 + 0xc) = iVar9 + 3;
          }
          lVar25 = auVar35._8_8_;
          auVar35._0_8_ = auVar35._0_8_ + 4;
          auVar35._8_8_ = lVar25 + 4;
          lVar25 = auVar33._8_8_;
          auVar33._0_8_ = auVar33._0_8_ + 4;
          auVar33._8_8_ = lVar25 + 4;
          uVar21 = (ulong)(iVar9 + 4);
          lVar28 = lVar28 + 0x10;
        } while ((ulong)(n + 3U >> 2) << 4 != lVar28);
      }
    }
LAB_007a037d:
    uVar10 = unique->slots + uVar24 * n;
    unique->slots = uVar10;
    unique->minDead = (uint)(long)((double)uVar10 * unique->gcFrac);
    uVar23 = unique->maxCacheHard;
    if (uVar10 * 4 < unique->maxCacheHard) {
      uVar23 = uVar10 * 4;
    }
    iVar9 = uVar23 + unique->cacheSlots * -2;
    unique->cacheSlack = iVar9;
    if (-1 < iVar9 && unique->cacheSlots < uVar10 >> 1) {
      cuddCacheResize(unique);
    }
    unique->size = unique->size + n;
    T = unique->one;
    iVar9 = unique->autoDyn;
    unique->autoDyn = 0;
    if (0 < n) {
      lVar28 = lVar22;
LAB_007a0436:
      iVar8 = (int)lVar28;
      pDVar18 = cuddUniqueInter(unique,iVar8,T,(DdNode *)((ulong)T ^ 1));
      unique->vars[lVar28] = pDVar18;
      if (unique->vars[lVar28] != (DdNode *)0x0) goto code_r0x007a0466;
      unique->autoDyn = iVar9;
      if ((int)uVar11 < iVar8) {
        lVar28 = lVar22;
        do {
          Cudd_IterDerefBdd(unique,unique->vars[lVar28]);
          ppDVar16 = unique->vars;
          ppDVar16[lVar28]->next = unique->nextFree;
          unique->nextFree = ppDVar16[lVar28];
          ppDVar16[lVar28] = (DdNode *)0x0;
          lVar28 = lVar28 + 1;
        } while (iVar8 != lVar28);
      }
      if (level < (int)uVar11) {
        lVar25 = (long)level;
        pDVar12 = unique->subtables;
        lVar28 = lVar25 * 0x38;
        do {
          puVar1 = (undefined8 *)((long)&pDVar12[uVar29].shift + lVar28);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pDVar12->shift + lVar28);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          *(undefined4 *)((long)&pDVar12->dead + lVar28) =
               *(undefined4 *)((long)&pDVar12[uVar29].dead + lVar28);
          __ptr = *(void **)((long)&pDVar12->nodelist + lVar28);
          if (__ptr != (void *)0x0) {
            free(__ptr);
            pDVar12 = unique->subtables;
            *(undefined8 *)((long)&pDVar12->nodelist + lVar28) = 0;
          }
          *(undefined8 *)((long)&pDVar12->nodelist + lVar28) =
               *(undefined8 *)((long)&pDVar12[uVar29].nodelist + lVar28);
          *(undefined8 *)((long)&pDVar12[uVar29].nodelist + lVar28) = 0;
          puVar1 = (undefined8 *)((long)&pDVar12[uVar29].bindVar + lVar28);
          uVar6 = puVar1[1];
          puVar2 = (undefined8 *)((long)&pDVar12->bindVar + lVar28);
          *puVar2 = *puVar1;
          puVar2[1] = uVar6;
          *(undefined4 *)((long)&pDVar12->varToBeGrouped + lVar28) =
               *(undefined4 *)((long)&pDVar12[uVar29].varToBeGrouped + lVar28);
          iVar9 = unique->invperm[lVar25 + uVar29];
          unique->invperm[lVar25] = iVar9;
          unique->perm[iVar9] = unique->perm[iVar9] - n;
          lVar25 = lVar25 + 1;
          lVar28 = lVar28 + 0x38;
        } while (lVar22 != lVar25);
      }
      unique->size = uVar11;
      uVar11 = unique->slots - uVar24 * n;
      unique->slots = uVar11;
      unique->minDead = (uint)(long)((double)uVar11 * unique->gcFrac);
      uVar24 = unique->maxCacheHard;
      if (uVar11 * 4 < unique->maxCacheHard) {
        uVar24 = uVar11 * 4;
      }
      iVar9 = uVar24 + unique->cacheSlots * -2;
      unique->cacheSlack = iVar9;
      if (-1 < iVar9 && unique->cacheSlots < uVar11 >> 1) {
        cuddCacheResize(unique);
      }
      Cudd_DebugCheck(unique);
      goto LAB_007a069a;
    }
LAB_007a0475:
    treenode = unique->tree;
    if (treenode != (MtrNode *)0x0) {
      treenode->size = treenode->size + n;
      treenode->index = *unique->invperm;
      ddPatchTree(unique,treenode);
    }
    unique->autoDyn = iVar9;
    iVar9 = 1;
  }
  return iVar9;
code_r0x007a0466:
  piVar4 = (int *)(((ulong)unique->vars[lVar28] & 0xfffffffffffffffe) + 4);
  *piVar4 = *piVar4 + 1;
  lVar28 = lVar28 + 1;
  if (iVar7 <= lVar28) goto LAB_007a0475;
  goto LAB_007a0436;
}

Assistant:

int
cuddInsertSubtables(
  DdManager * unique,
  int  n,
  int  level)
{
    DdSubtable *newsubtables;
    DdNodePtr *newnodelist;
    DdNodePtr *newvars;
    DdNode *sentinel = &(unique->sentinel);
    int oldsize,newsize;
    int i,j,index,reorderSave;
    unsigned int numSlots = unique->initSlots;
    int *newperm, *newinvperm, *newmap=NULL;
    DdNode *one, *zero;

#ifdef DD_DEBUG
    assert(n > 0 && level < unique->size);
#endif

    oldsize = unique->size;
    /* Easy case: there is still room in the current table. */
    if (oldsize + n <= unique->maxSize) {
        /* Shift the tables at and below level. */
        for (i = oldsize - 1; i >= level; i--) {
            unique->subtables[i+n].slots    = unique->subtables[i].slots;
            unique->subtables[i+n].shift    = unique->subtables[i].shift;
            unique->subtables[i+n].keys     = unique->subtables[i].keys;
            unique->subtables[i+n].maxKeys  = unique->subtables[i].maxKeys;
            unique->subtables[i+n].dead     = unique->subtables[i].dead;
            unique->subtables[i+n].nodelist = unique->subtables[i].nodelist;
            unique->subtables[i+n].bindVar  = unique->subtables[i].bindVar;
            unique->subtables[i+n].varType  = unique->subtables[i].varType;
            unique->subtables[i+n].pairIndex  = unique->subtables[i].pairIndex;
            unique->subtables[i+n].varHandled = unique->subtables[i].varHandled;
            unique->subtables[i+n].varToBeGrouped =
                unique->subtables[i].varToBeGrouped;

            index                           = unique->invperm[i];
            unique->invperm[i+n]            = index;
            unique->perm[index]            += n;
        }
        /* Create new subtables. */
        for (i = 0; i < n; i++) {
            unique->subtables[level+i].slots = numSlots;
            unique->subtables[level+i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            unique->subtables[level+i].keys = 0;
            unique->subtables[level+i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            unique->subtables[level+i].dead = 0;
            unique->subtables[level+i].bindVar = 0;
            unique->subtables[level+i].varType = CUDD_VAR_PRIMARY_INPUT;
            unique->subtables[level+i].pairIndex = 0;
            unique->subtables[level+i].varHandled = 0;
            unique->subtables[level+i].varToBeGrouped = CUDD_LAZY_NONE;

            unique->perm[oldsize+i] = level + i;
            unique->invperm[level+i] = oldsize + i;
            newnodelist = unique->subtables[level+i].nodelist =
                ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = sentinel;
            }
        }
        if (unique->map != NULL) {
            for (i = 0; i < n; i++) {
                unique->map[oldsize+i] = oldsize + i;
            }
        }
    } else {
        /* The current table is too small: we need to allocate a new,
        ** larger one; move all old subtables, and initialize the new
        ** subtables.
        */
        newsize = oldsize + n + DD_DEFAULT_RESIZE;
#ifdef DD_VERBOSE
        (void) fprintf(unique->err,
                       "Increasing the table size from %d to %d\n",
            unique->maxSize, newsize);
#endif
        /* Allocate memory for new arrays (except nodelists). */
        newsubtables = ABC_ALLOC(DdSubtable,newsize);
        if (newsubtables == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            return(0);
        }
        newvars = ABC_ALLOC(DdNodePtr,newsize);
        if (newvars == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(newsubtables);
            return(0);
        }
        newperm = ABC_ALLOC(int,newsize);
        if (newperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(newsubtables);
            ABC_FREE(newvars);
            return(0);
        }
        newinvperm = ABC_ALLOC(int,newsize);
        if (newinvperm == NULL) {
            unique->errorCode = CUDD_MEMORY_OUT;
            ABC_FREE(newsubtables);
            ABC_FREE(newvars);
            ABC_FREE(newperm);
            return(0);
        }
        if (unique->map != NULL) {
            newmap = ABC_ALLOC(int,newsize);
            if (newmap == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                ABC_FREE(newsubtables);
                ABC_FREE(newvars);
                ABC_FREE(newperm);
                ABC_FREE(newinvperm);
                return(0);
            }
            unique->memused += (newsize - unique->maxSize) * sizeof(int);
        }
        unique->memused += (newsize - unique->maxSize) * ((numSlots+1) *
            sizeof(DdNode *) + 2 * sizeof(int) + sizeof(DdSubtable));
        /* Copy levels before insertion points from old tables. */
        for (i = 0; i < level; i++) {
            newsubtables[i].slots = unique->subtables[i].slots;
            newsubtables[i].shift = unique->subtables[i].shift;
            newsubtables[i].keys = unique->subtables[i].keys;
            newsubtables[i].maxKeys = unique->subtables[i].maxKeys;
            newsubtables[i].dead = unique->subtables[i].dead;
            newsubtables[i].nodelist = unique->subtables[i].nodelist;
            newsubtables[i].bindVar = unique->subtables[i].bindVar;
            newsubtables[i].varType = unique->subtables[i].varType;
            newsubtables[i].pairIndex = unique->subtables[i].pairIndex;
            newsubtables[i].varHandled = unique->subtables[i].varHandled;
            newsubtables[i].varToBeGrouped = unique->subtables[i].varToBeGrouped;

            newvars[i] = unique->vars[i];
            newperm[i] = unique->perm[i];
            newinvperm[i] = unique->invperm[i];
        }
        /* Finish initializing permutation for new table to old one. */
        for (i = level; i < oldsize; i++) {
            newperm[i] = unique->perm[i];
        }
        /* Initialize new levels. */
        for (i = level; i < level + n; i++) {
            newsubtables[i].slots = numSlots;
            newsubtables[i].shift = sizeof(int) * 8 -
                cuddComputeFloorLog2(numSlots);
            newsubtables[i].keys = 0;
            newsubtables[i].maxKeys = numSlots * DD_MAX_SUBTABLE_DENSITY;
            newsubtables[i].dead = 0;
            newsubtables[i].bindVar = 0;
            newsubtables[i].varType = CUDD_VAR_PRIMARY_INPUT;
            newsubtables[i].pairIndex = 0;
            newsubtables[i].varHandled = 0;
            newsubtables[i].varToBeGrouped = CUDD_LAZY_NONE;

            newperm[oldsize + i - level] = i;
            newinvperm[i] = oldsize + i - level;
            newnodelist = newsubtables[i].nodelist = ABC_ALLOC(DdNodePtr, numSlots);
            if (newnodelist == NULL) {
                /* We are going to leak some memory.  We should clean up. */
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            for (j = 0; (unsigned) j < numSlots; j++) {
                newnodelist[j] = sentinel;
            }
        }
        /* Copy the old tables for levels past the insertion point. */
        for (i = level; i < oldsize; i++) {
            newsubtables[i+n].slots    = unique->subtables[i].slots;
            newsubtables[i+n].shift    = unique->subtables[i].shift;
            newsubtables[i+n].keys     = unique->subtables[i].keys;
            newsubtables[i+n].maxKeys  = unique->subtables[i].maxKeys;
            newsubtables[i+n].dead     = unique->subtables[i].dead;
            newsubtables[i+n].nodelist = unique->subtables[i].nodelist;
            newsubtables[i+n].bindVar  = unique->subtables[i].bindVar;
            newsubtables[i+n].varType  = unique->subtables[i].varType;
            newsubtables[i+n].pairIndex  = unique->subtables[i].pairIndex;
            newsubtables[i+n].varHandled  = unique->subtables[i].varHandled;
            newsubtables[i+n].varToBeGrouped  =
                unique->subtables[i].varToBeGrouped;

            newvars[i]                 = unique->vars[i];
            index                      = unique->invperm[i];
            newinvperm[i+n]            = index;
            newperm[index]            += n;
        }
        /* Update the map. */
        if (unique->map != NULL) {
            for (i = 0; i < oldsize; i++) {
                newmap[i] = unique->map[i];
            }
            for (i = oldsize; i < oldsize + n; i++) {
                newmap[i] = i;
            }
            ABC_FREE(unique->map);
            unique->map = newmap;
        }
        /* Install the new tables and free the old ones. */
        ABC_FREE(unique->subtables);
        unique->subtables = newsubtables;
        unique->maxSize = newsize;
        ABC_FREE(unique->vars);
        unique->vars = newvars;
        ABC_FREE(unique->perm);
        unique->perm = newperm;
        ABC_FREE(unique->invperm);
        unique->invperm = newinvperm;
        /* Update the stack for iterative procedures. */
        if (newsize > unique->maxSizeZ) {
            ABC_FREE(unique->stack);
            unique->stack = ABC_ALLOC(DdNodePtr,newsize + 1);
            if (unique->stack == NULL) {
                unique->errorCode = CUDD_MEMORY_OUT;
                return(0);
            }
            unique->stack[0] = NULL; /* to suppress harmless UMR */
            unique->memused +=
                (newsize - ddMax(unique->maxSize,unique->maxSizeZ))
                * sizeof(DdNode *);
        }
    }
    /* Update manager parameters to account for the new subtables. */
    unique->slots += n * numSlots;
    ddFixLimits(unique);
    unique->size += n;

    /* Now that the table is in a coherent state, create the new
    ** projection functions. We need to temporarily disable reordering,
    ** because we cannot reorder without projection functions in place.
    **/
    one = unique->one;
    zero = Cudd_Not(one);

    reorderSave = unique->autoDyn;
    unique->autoDyn = 0;
    for (i = oldsize; i < oldsize + n; i++) {
        unique->vars[i] = cuddUniqueInter(unique,i,one,zero);
        if (unique->vars[i] == NULL) {
            unique->autoDyn = reorderSave;
            /* Shift everything back so table remains coherent. */
            for (j = oldsize; j < i; j++) {
                Cudd_IterDerefBdd(unique,unique->vars[j]);
                cuddDeallocNode(unique,unique->vars[j]);
                unique->vars[j] = NULL;
            }
            for (j = level; j < oldsize; j++) {
                unique->subtables[j].slots    = unique->subtables[j+n].slots;
                unique->subtables[j].slots    = unique->subtables[j+n].slots;
                unique->subtables[j].shift    = unique->subtables[j+n].shift;
                unique->subtables[j].keys     = unique->subtables[j+n].keys;
                unique->subtables[j].maxKeys  =
                    unique->subtables[j+n].maxKeys;
                unique->subtables[j].dead     = unique->subtables[j+n].dead;
                ABC_FREE(unique->subtables[j].nodelist);
                unique->subtables[j].nodelist =
                    unique->subtables[j+n].nodelist;
                unique->subtables[j+n].nodelist = NULL;
                unique->subtables[j].bindVar  =
                    unique->subtables[j+n].bindVar;
                unique->subtables[j].varType  =
                    unique->subtables[j+n].varType;
                unique->subtables[j].pairIndex =
                    unique->subtables[j+n].pairIndex;
                unique->subtables[j].varHandled =
                    unique->subtables[j+n].varHandled;
                unique->subtables[j].varToBeGrouped =
                    unique->subtables[j+n].varToBeGrouped;
                index                         = unique->invperm[j+n];
                unique->invperm[j]            = index;
                unique->perm[index]          -= n;
            }
            unique->size = oldsize;
            unique->slots -= n * numSlots;
            ddFixLimits(unique);
            (void) Cudd_DebugCheck(unique);
            return(0);
        }
        cuddRef(unique->vars[i]);
    }
    if (unique->tree != NULL) {
        unique->tree->size += n;
        unique->tree->index = unique->invperm[0];
        ddPatchTree(unique,unique->tree);
    }
    unique->autoDyn = reorderSave;

    return(1);

}